

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPolComponent_VectorImplementation.cpp
# Opt level: O0

LIndex __thiscall
JPolComponent_VectorImplementation::GetIndex(JPolComponent_VectorImplementation *this)

{
  Interface_ProblemToPolicyDiscretePure *pIVar1;
  reference pvVar2;
  const_reference ppPVar3;
  LIndex LVar4;
  long in_RDI;
  int k_1;
  LIndex i;
  int k;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> individualIndices;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> nrIndPol;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> indexVec;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> nrElems;
  int nrAgents;
  JPolComponent_VectorImplementation *in_stack_fffffffffffffe88;
  allocator_type *in_stack_fffffffffffffea0;
  size_type in_stack_fffffffffffffea8;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *nrElems_00;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *in_stack_fffffffffffffeb0;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *indices;
  size_t in_stack_fffffffffffffec0;
  size_type __n;
  undefined8 in_stack_fffffffffffffec8;
  value_type vVar5;
  Interface_ProblemToPolicyDiscretePure *in_stack_fffffffffffffed0;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *this_00;
  int local_ac;
  value_type local_a8;
  int iVar6;
  undefined4 in_stack_ffffffffffffff64;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> local_98;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> local_78;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> local_58 [2];
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> local_28;
  int local_c;
  
  pIVar1 = GetInterfacePTPDiscretePure(in_stack_fffffffffffffe88);
  local_c = (*(pIVar1->super_Interface_ProblemToPolicyDiscrete).
              _vptr_Interface_ProblemToPolicyDiscrete[3])();
  std::allocator<unsigned_long_long>::allocator((allocator<unsigned_long_long> *)0x987e2c);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  std::allocator<unsigned_long_long>::~allocator((allocator<unsigned_long_long> *)0x987e55);
  pvVar2 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                     (&local_28,0);
  *pvVar2 = 1;
  pvVar2 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                     (&local_28,1);
  *pvVar2 = 1;
  std::allocator<unsigned_long_long>::allocator((allocator<unsigned_long_long> *)0x987ea3);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  std::allocator<unsigned_long_long>::~allocator((allocator<unsigned_long_long> *)0x987ecc);
  std::allocator<unsigned_long_long>::allocator((allocator<unsigned_long_long> *)0x987ef1);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  std::allocator<unsigned_long_long>::~allocator((allocator<unsigned_long_long> *)0x987f1d);
  std::allocator<unsigned_long_long>::allocator((allocator<unsigned_long_long> *)0x987f42);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  std::allocator<unsigned_long_long>::~allocator((allocator<unsigned_long_long> *)0x987f6e);
  for (iVar6 = 0; iVar6 < local_c; iVar6 = iVar6 + 1) {
    GetInterfacePTPDiscretePure(in_stack_fffffffffffffe88);
    ppPVar3 = std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::operator[]
                        ((vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_> *)
                         (in_RDI + 0x30),(long)iVar6);
    Policy::GetDepth((Policy *)*ppPVar3);
    LVar4 = Interface_ProblemToPolicyDiscretePure::GetNrPolicies
                      (in_stack_fffffffffffffed0,(Index)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                       (PolicyDomainCategory)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    pvVar2 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       (&local_78,(long)iVar6);
    *pvVar2 = LVar4;
    std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::operator[]
              ((vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_> *)(in_RDI + 0x30),
               (long)iVar6);
    LVar4 = PolicyPureVector::GetIndex
                      ((PolicyPureVector *)CONCAT44(in_stack_ffffffffffffff64,iVar6));
    pvVar2 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       (&local_98,(long)iVar6);
    *pvVar2 = LVar4;
  }
  pvVar2 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                     (&local_98,0);
  local_a8 = *pvVar2;
  for (local_ac = 1; local_ac < local_c; local_ac = local_ac + 1) {
    in_stack_fffffffffffffea0 = (allocator_type *)&local_78;
    pvVar2 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                        in_stack_fffffffffffffea0,(long)(local_ac + -1));
    vVar5 = *pvVar2;
    indices = (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)0x0;
    pvVar2 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       (&local_28,0);
    *pvVar2 = *pvVar2 * vVar5;
    pvVar2 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                        in_stack_fffffffffffffea0,(long)local_ac);
    nrElems_00 = (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)*pvVar2;
    __n = 1;
    pvVar2 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       (&local_28,1);
    *pvVar2 = (value_type)nrElems_00;
    this_00 = local_58;
    pvVar2 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       (this_00,(size_type)indices);
    *pvVar2 = local_a8;
    pvVar2 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       (&local_98,(long)local_ac);
    vVar5 = *pvVar2;
    pvVar2 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       (this_00,__n);
    *pvVar2 = vVar5;
    local_a8 = IndexTools::IndividualToJointIndices(indices,nrElems_00);
  }
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
             in_stack_fffffffffffffea0);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
             in_stack_fffffffffffffea0);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
             in_stack_fffffffffffffea0);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
             in_stack_fffffffffffffea0);
  return local_a8;
}

Assistant:

LIndex JPolComponent_VectorImplementation::GetIndex() const
{
    int nrAgents=GetInterfacePTPDiscretePure()->GetNrAgents();

    vector<LIndex> nrElems(2);
    nrElems[0]=1;
    nrElems[1]=1;

    vector<LIndex> indexVec(2);

    vector<LIndex> nrIndPol(nrAgents);
    vector<LIndex> individualIndices(nrAgents);
    for(int k=0;k<nrAgents;++k)
    {
        nrIndPol[k]=GetInterfacePTPDiscretePure()->GetNrPolicies(k, _m_idc,
                                            _m_indivPols_PolicyPureVector[k]->
                                            GetDepth());
        individualIndices[k]=_m_indivPols_PolicyPureVector[k]->GetIndex();
    }

    LIndex i=individualIndices[0];

    for(int k=1;k<nrAgents;++k)
    {
        
        nrElems[0]*=nrIndPol[k-1];
        nrElems[1]=nrIndPol[k];

        indexVec[0]=i;
        indexVec[1]=individualIndices[k];
        i=IndexTools::IndividualToJointIndices(indexVec,nrElems);
#if 0
        cout << SoftPrintVector(nrIndPol) << " "
             << SoftPrintVector(individualIndices)
             << " " << k << " "
             << SoftPrintVector(indexVec) << " "
             << SoftPrintVector(nrElems) << endl;
#endif
    }
    return(i);
}